

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hand.cpp
# Opt level: O3

bool __thiscall Hand::checkSize(Hand *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  
  if (this->shouldCheckSize != true) {
    this->ok = true;
    return true;
  }
  if ((((double)(this->areaLimits).width < this->area) &&
      (this->area < (double)(this->areaLimits).height)) &&
     (iVar1 = this->maxAspectRatio, iVar1 != -1)) {
    iVar2 = (this->border).width;
    iVar3 = (this->border).height;
    if (iVar3 / iVar2 <= iVar1) {
      bVar4 = iVar2 / iVar3 <= iVar1;
      goto LAB_00109027;
    }
  }
  bVar4 = false;
LAB_00109027:
  this->ok = bVar4;
  return bVar4;
}

Assistant:

bool Hand::checkSize() {
    if (shouldCheckSize) {
        ok = (area > areaLimits.width && area < areaLimits.height) &&
             (maxAspectRatio != -1 && border.height / border.width <= maxAspectRatio &&
              border.width / border.height <= maxAspectRatio);
    } else
        ok = true;
    return ok;
}